

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

int EDCircles::inverse(double **TB,double **InvB,int N)

{
  undefined8 uVar1;
  double *pdVar2;
  double *pdVar3;
  uint uVar4;
  uint uVar5;
  double **m;
  double **m_00;
  double **m_01;
  ulong uVar6;
  uint noRows;
  uint noColumns;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  ulong uVar7;
  
  noRows = N + 1;
  uVar7 = (ulong)noRows;
  noColumns = N + 2;
  m = AllocateMatrix(noRows,noColumns);
  m_00 = AllocateMatrix(noRows,N * 2 + 2);
  m_01 = AllocateMatrix(noRows,noRows);
  if (0 < N) {
    uVar6 = 1;
    do {
      pdVar2 = TB[uVar6];
      pdVar3 = m[uVar6];
      uVar9 = 1;
      do {
        pdVar3[uVar9] = pdVar2[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar7);
  }
  uVar4 = N * 2;
  if (0 < N) {
    uVar5 = uVar4 | 1;
    if ((int)(uVar4 | 1) < (int)noColumns) {
      uVar5 = noColumns;
    }
    uVar6 = 1;
    do {
      pdVar2 = m[uVar6];
      pdVar3 = m_00[uVar6];
      uVar9 = 1;
      do {
        pdVar3[uVar9] = pdVar2[uVar9];
        uVar9 = uVar9 + 1;
      } while (noColumns != uVar9);
      if (N < (int)uVar4) {
        memset(m_00[uVar6] + noColumns,0,(ulong)((uVar5 - N) - 2) * 8 + 8);
      }
      m_00[uVar6][(long)(N + -1 + (int)uVar6) + 2] = 1.0;
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar7);
  }
  if (0 < N) {
    uVar6 = (ulong)(uVar4 | 1);
    uVar9 = (ulong)(uVar4 + 2);
    uVar10 = 1;
    lVar11 = 0;
    do {
      pdVar2 = m_00[uVar10];
      dVar15 = ABS(pdVar2[uVar10]);
      uVar14 = uVar10 & 0xffffffff;
      uVar13 = uVar10;
      do {
        if (dVar15 < ABS(m_00[uVar13][uVar10])) {
          uVar14 = uVar13 & 0xffffffff;
          dVar15 = ABS(m_00[uVar13][uVar10]);
        }
        uVar13 = uVar13 + 1;
      } while (uVar7 != uVar13);
      if (dVar15 < 1e-19) {
        iVar8 = -1;
        goto LAB_00112a98;
      }
      if (uVar10 <= uVar6 && uVar10 != uVar14) {
        pdVar3 = m_00[(int)uVar14];
        uVar14 = 1;
        do {
          uVar1 = *(undefined8 *)((long)pdVar3 + uVar14 * 8 + lVar11);
          *(undefined8 *)((long)pdVar3 + uVar14 * 8 + lVar11) =
               *(undefined8 *)((long)pdVar2 + uVar14 * 8 + lVar11);
          *(undefined8 *)((long)pdVar2 + uVar14 * 8 + lVar11) = uVar1;
          uVar14 = uVar14 + 1;
        } while (uVar9 != uVar14);
      }
      if (uVar10 <= uVar6) {
        dVar15 = pdVar2[uVar10];
        lVar12 = (ulong)uVar4 + 2;
        do {
          pdVar2[lVar12 + -1] = pdVar2[lVar12 + -1] / dVar15;
          lVar12 = lVar12 + -1;
        } while ((long)uVar10 < lVar12);
      }
      uVar14 = 1;
      do {
        if ((uVar14 != uVar10) && (uVar10 <= uVar6)) {
          pdVar3 = m_00[uVar14];
          dVar15 = pdVar3[uVar10];
          lVar12 = (ulong)uVar4 + 2;
          do {
            pdVar3[lVar12 + -1] = pdVar2[lVar12 + -1] * -dVar15 + pdVar3[lVar12 + -1];
            lVar12 = lVar12 + -1;
          } while ((long)uVar10 < lVar12);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar7);
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 8;
      uVar9 = uVar9 - 1;
    } while (uVar10 != uVar7);
  }
  if (0 < N) {
    uVar6 = 1;
    do {
      if (N < (int)uVar4) {
        pdVar2 = InvB[uVar6];
        pdVar3 = m_00[uVar6];
        lVar11 = 0;
        do {
          pdVar2[lVar11 + 1] = pdVar3[(ulong)noColumns + lVar11];
          lVar11 = lVar11 + 1;
        } while (N + 1 + (int)lVar11 <= (int)uVar4);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar7);
  }
  iVar8 = 0;
LAB_00112a98:
  DeallocateMatrix(m,noRows);
  DeallocateMatrix(m_00,noRows);
  DeallocateMatrix(m_01,noRows);
  return iVar8;
}

Assistant:

int EDCircles::inverse(double ** TB, double ** InvB, int N)
{
	int k, i, j, p, q;
	double mult;
	double D, temp;
	double maxpivot;
	int npivot;
	double **B = AllocateMatrix(N + 1, N + 2);
	double **A = AllocateMatrix(N + 1, 2 * N + 2);
	double **C = AllocateMatrix(N + 1, N + 1);
	double eps = 10e-20;

	for (k = 1; k <= N; k++)
		for (j = 1; j <= N; j++)
			B[k][j] = TB[k][j];

	for (k = 1; k <= N; k++)
	{
		for (j = 1; j <= N + 1; j++)
			A[k][j] = B[k][j];
		for (j = N + 2; j <= 2 * N + 1; j++)
			A[k][j] = (double)0;
		A[k][k - 1 + N + 2] = (double)1;
	}
	for (k = 1; k <= N; k++)
	{
		maxpivot = fabs((double)A[k][k]);
		npivot = k;
		for (i = k; i <= N; i++)
			if (maxpivot < fabs((double)A[i][k]))
			{
				maxpivot = fabs((double)A[i][k]);
				npivot = i;
			}
		if (maxpivot >= eps)
		{
			if (npivot != k)
				for (j = k; j <= 2 * N + 1; j++)
				{
					temp = A[npivot][j];
					A[npivot][j] = A[k][j];
					A[k][j] = temp;
				};
			D = A[k][k];
			for (j = 2 * N + 1; j >= k; j--)
				A[k][j] = A[k][j] / D;
			for (i = 1; i <= N; i++)
			{
				if (i != k)
				{
					mult = A[i][k];
					for (j = 2 * N + 1; j >= k; j--)
						A[i][j] = A[i][j] - mult * A[k][j];
				}
			}
		}
		else
		{  // printf("\n The matrix may be singular !!") ;

			DeallocateMatrix(B, N + 1);
			DeallocateMatrix(A, N + 1);
			DeallocateMatrix(C, N + 1);

			return (-1);
		} //end-else
	}
	/**   Copia il risultato nella matrice InvB  ***/
	for (k = 1, p = 1; k <= N; k++, p++)
		for (j = N + 2, q = 1; j <= 2 * N + 1; j++, q++)
			InvB[p][q] = A[k][j];

	DeallocateMatrix(B, N + 1);
	DeallocateMatrix(A, N + 1);
	DeallocateMatrix(C, N + 1);

	return (0);
}